

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hxx
# Opt level: O0

XMLNodeAdapter *
FileParse::operator<<
          (XMLNodeAdapter *node,
          Child<const_std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>
          *vec)

{
  vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_> *this;
  bool bVar1;
  const_reference this_00;
  __sv_type name;
  undefined1 local_78 [8];
  XMLNodeAdapter lastNode;
  AngleBasisBlock *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_> *__range2;
  value_type *lastNodeName;
  XMLNodeAdapter secondToLastNode;
  Child<const_std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>
  *vec_local;
  XMLNodeAdapter *node_local;
  
  secondToLastNode.pimpl_.super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vec;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&vec->nodeNames);
  if ((!bVar1) &&
     (bVar1 = std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>::
              empty(*(vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>
                      **)&secondToLastNode.pimpl_.
                          super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[1]._M_use_count), !bVar1)) {
    insertAllButLastChild<XMLNodeAdapter>
              ((XMLNodeAdapter *)&lastNodeName,node,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)secondToLastNode.pimpl_.
                  super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi);
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)secondToLastNode.pimpl_.
                        super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    this = *(vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_> **)
            &secondToLastNode.pimpl_.
             super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [1]._M_use_count;
    __end0 = std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>::
             begin(this);
    item = (AngleBasisBlock *)
           std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>::end
                     (this);
    while (bVar1 = __gnu_cxx::
                   operator==<const_BSDFData::AngleBasisBlock_*,_std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>
                             (&__end0,(__normal_iterator<const_BSDFData::AngleBasisBlock_*,_std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>
                                       *)&item), ((bVar1 ^ 0xffU) & 1) != 0) {
      lastNode.pimpl_.super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<const_BSDFData::AngleBasisBlock_*,_std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>
           ::operator*(&__end0);
      name = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
      XMLNodeAdapter::addChild((XMLNodeAdapter *)local_78,(XMLNodeAdapter *)&lastNodeName,name);
      BSDFData::operator<<
                ((XMLNodeAdapter *)local_78,
                 (AngleBasisBlock *)
                 lastNode.pimpl_.
                 super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      XMLNodeAdapter::~XMLNodeAdapter((XMLNodeAdapter *)local_78);
      __gnu_cxx::
      __normal_iterator<const_BSDFData::AngleBasisBlock_*,_std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>
      ::operator++(&__end0);
    }
    XMLNodeAdapter::~XMLNodeAdapter((XMLNodeAdapter *)&lastNodeName);
  }
  return node;
}

Assistant:

inline NodeAdapter & operator<<(NodeAdapter & node, const Child<const std::vector<T>> & vec)
    {
        if(vec.nodeNames.empty() || vec.data.empty())
            return node;

        auto secondToLastNode{insertAllButLastChild(node, vec.nodeNames)};

        const auto & lastNodeName = vec.nodeNames.back();

        for(const auto & item : vec.data)
        {
            NodeAdapter lastNode = secondToLastNode.addChild(lastNodeName);
            lastNode << item;
        }

        return node;
    }